

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Add_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int64 iVar4;
  int64 iVar5;
  Var pvVar6;
  JavascriptNumber *pJVar7;
  double dVar8;
  double dVar9;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17d,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) goto LAB_00a9c968;
    *puVar3 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17e,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) goto LAB_00a9c968;
    *puVar3 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) goto LAB_00a9c968;
    *puVar3 = 0;
  }
  if (result == (JavascriptNumber *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x180,"(result != nullptr)","result != nullptr");
    if (!bVar2) goto LAB_00a9c968;
    *puVar3 = 0;
  }
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9c75c;
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9c968;
      *puVar3 = 0;
LAB_00a9c8cd:
      if ((ulong)aLeft >> 0x32 == 0) goto LAB_00a9c949;
      dVar9 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      dVar8 = (double)(int)aRight;
      goto LAB_00a9c92c;
    }
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9c8cd;
    if ((ulong)aRight >> 0x32 == 0 || (ulong)aLeft >> 0x32 == 0) goto LAB_00a9c949;
    dVar9 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00a9c968;
    *puVar3 = 0;
LAB_00a9c75c:
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00a9c968:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
LAB_00a9c7e9:
      iVar4 = TaggedInt::ToInt64(aLeft);
      iVar5 = TaggedInt::ToInt64(aRight);
      pvVar6 = JavascriptNumber::ToVarInPlace(iVar4 + iVar5,scriptContext,result);
      return pvVar6;
    }
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9c7e9;
    if ((ulong)aRight >> 0x32 == 0) {
LAB_00a9c949:
      pvVar6 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,result,false);
      return pvVar6;
    }
    dVar9 = (double)(int)aLeft;
  }
  dVar8 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00a9c92c:
  pJVar7 = JavascriptNumber::InPlaceNew(dVar8 + dVar9,scriptContext,result);
  return pJVar7;
}

Assistant:

Var JavascriptMath::Add_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_AddInPlace);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);
            Assert(result != nullptr);

            // If both sides are numbers, then we can do the addition directly, otherwise
            // we need to call the helper.
            if( TaggedInt::Is(aLeft) )
            {
                if( TaggedInt::Is(aRight) )
                {
                    // Compute the sum using integer addition, then convert to double.
                    // That way there's only one int->float conversion.
#if INT32VAR
                    int64 sum = TaggedInt::ToInt64(aLeft) + TaggedInt::ToInt64(aRight);
#else
                    int32 sum = TaggedInt::ToInt32(aLeft) + TaggedInt::ToInt32(aRight);
#endif

                    return JavascriptNumber::ToVarInPlace(sum, scriptContext, result);
                }
                else if( JavascriptNumber::Is_NoTaggedIntCheck(aRight) )
                {
                    double sum = TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
                }
            }
            else if( TaggedInt::Is(aRight) )
            {
                if( JavascriptNumber::Is_NoTaggedIntCheck(aLeft) )
                {
                    double sum = JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight);
                    return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
                }
            }
            else if( JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight) )
            {
                double sum = JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight);
                return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
            }

            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, result, false);
            JIT_HELPER_END(Op_AddInPlace);
        }